

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86::forward(Deconvolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 *puVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  size_t sVar5;
  size_t sVar6;
  Layer *pLVar7;
  int *piVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  long lVar24;
  Mat *pMVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  undefined8 *puVar31;
  undefined1 (*pauVar32) [16];
  long lVar33;
  _func_int **pp_Var34;
  long lVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  void *pvVar40;
  long lVar41;
  float *pfVar42;
  int iVar43;
  ulong uVar44;
  int i;
  int iVar45;
  int iVar46;
  uint uVar47;
  uint uVar48;
  _func_int *p_Var49;
  ulong uVar50;
  void *pvVar51;
  int y_2;
  ulong uVar52;
  ulong uVar53;
  _func_int *p_Var54;
  byte bVar55;
  int v_1;
  int iVar56;
  long lVar57;
  void *pvVar58;
  int i_1;
  float *pfVar59;
  ulong uVar60;
  undefined8 *puVar61;
  _func_int **pp_Var62;
  int iVar63;
  int iVar64;
  uint uVar65;
  _func_int **pp_Var66;
  int iVar67;
  long lVar68;
  undefined4 uVar69;
  undefined1 extraout_var [12];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [12];
  float fVar88;
  float fVar89;
  float fVar90;
  v4sf one;
  float fVar91;
  float fVar92;
  float fVar102;
  float fVar103;
  __m128 pos;
  undefined1 auVar94 [16];
  float fVar104;
  undefined1 auVar95 [16];
  float fVar93;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  long lStackY_290;
  float *local_270;
  undefined1 (*local_260) [16];
  void *local_250;
  void *local_230;
  Mat local_1a8;
  Option *local_158;
  _func_int *local_150;
  int local_148;
  int local_144;
  ulong local_140;
  _func_int **local_138;
  long local_130;
  Mat *local_128;
  void *local_120;
  long local_118;
  void *local_110;
  int *local_108;
  size_t local_100;
  int local_f8;
  Allocator *local_f0;
  undefined4 local_e8;
  int iStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  int local_d8;
  size_t local_d0;
  void *local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  long *local_a8;
  undefined4 uStack_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined8 uStack_94;
  undefined8 local_88;
  Option opt_b;
  
  p_Var54 = this->_vptr_Deconvolution_x86[-3];
  local_144 = (*(int *)(&this->field_0xd4 + (long)p_Var54) + -1) *
              *(int *)(&this->field_0xdc + (long)p_Var54);
  uVar37 = bottom_blob->w;
  iVar64 = *(int *)(&this->field_0xe4 + (long)p_Var54);
  local_148 = (*(int *)(&this->field_0xd8 + (long)p_Var54) + -1) *
              *(int *)(&this->field_0xe0 + (long)p_Var54);
  iVar67 = bottom_blob->h;
  iVar45 = *(int *)(&this->field_0xe8 + (long)p_Var54);
  iVar43 = *(int *)(&this->field_0xfc + (long)p_Var54);
  iVar46 = *(int *)(&this->field_0x100 + (long)p_Var54);
  bVar55 = (*(uint *)(&this->field_0xd0 + (long)p_Var54) & 3) == 0 & opt->use_packing_layout;
  uVar52 = bottom_blob->elemsize;
  local_140 = (ulong)bottom_blob->elempack;
  iVar56 = (uint)bVar55 + (uint)bVar55 * 2 + 1;
  uVar44 = (long)(int)*(uint *)(&this->field_0xd0 + (long)p_Var54) / (long)iVar56;
  uVar53 = uVar44 & 0xffffffff;
  local_1a8.cstep = 0;
  local_1a8.data = (void *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize._0_4_ = 0;
  local_1a8.elemsize._4_4_ = 0;
  local_1a8.elempack = 0;
  local_1a8.allocator = (Allocator *)0x0;
  local_1a8.dims = 0;
  local_1a8.w = 0;
  local_1a8.h = 0;
  local_1a8.d = 0;
  local_1a8.c = 0;
  p_Var54 = this->_vptr_Deconvolution_x86[-3];
  lStackY_290 = 0x10;
  if ((((((*(int *)(&this->field_0xec + (long)p_Var54) < 1) &&
         (*(int *)(&this->field_0xf0 + (long)p_Var54) < 1)) &&
        (*(int *)(&this->field_0xf4 + (long)p_Var54) < 1)) &&
       (*(int *)(&this->field_0xf8 + (long)p_Var54) < 1)) &&
      ((*(int *)(&this->field_0x104 + (long)p_Var54) < 1 ||
       (*(int *)(&this->field_0x108 + (long)p_Var54) < 1)))) &&
     (lStackY_290 = 8, &local_1a8 != top_blob)) {
    piVar8 = top_blob->refcount;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + 1;
      UNLOCK();
    }
    lStackY_290 = 8;
    local_1a8.data = top_blob->data;
    local_1a8.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_1a8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_1a8.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_1a8.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_1a8.elempack = top_blob->elempack;
    local_1a8.allocator = top_blob->allocator;
    uVar20 = top_blob->dims;
    uVar21 = top_blob->w;
    uVar22 = top_blob->h;
    uVar23 = top_blob->d;
    local_1a8.c = top_blob->c;
    local_1a8.cstep = top_blob->cstep;
    local_1a8.dims = uVar20;
    local_1a8.w = uVar21;
    local_1a8.h = uVar22;
    local_1a8.d = uVar23;
  }
  iVar63 = (uVar37 - 1) * iVar64 + local_144 + iVar43 + 1;
  iVar43 = (int)uVar44;
  local_158 = opt;
  local_128 = top_blob;
  Mat::create(&local_1a8,iVar63,iVar46 + 1 + (iVar67 + -1) * iVar45 + local_148,iVar43,
              uVar52 / local_140 << bVar55 * '\x02',iVar56,
              *(Allocator **)(&opt->lightmode + lStackY_290));
  auVar70 = _DAT_004edaa0;
  auVar79 = _DAT_004eda70;
  auVar78 = _DAT_004eda60;
  iVar64 = -100;
  if ((local_1a8.data != (void *)0x0) && (local_1a8.cstep * (long)local_1a8.c != 0)) {
    pp_Var62 = this->_vptr_Deconvolution_x86;
    p_Var54 = pp_Var62[-3];
    uVar65 = *(uint *)(&this->field_0xd4 + (long)p_Var54);
    uVar28 = *(uint *)(&this->field_0xd8 + (long)p_Var54);
    local_130 = (long)(int)(uVar28 * uVar65);
    if (local_158->use_sgemm_convolution == true) {
      local_110 = bottom_blob->data;
      local_108 = bottom_blob->refcount;
      local_100 = bottom_blob->elemsize;
      local_f8 = bottom_blob->elempack;
      local_f0 = bottom_blob->allocator;
      uVar18 = bottom_blob->dims;
      uVar19 = bottom_blob->d;
      iVar64 = bottom_blob->w;
      iVar45 = bottom_blob->h;
      local_d8 = bottom_blob->c;
      local_d0 = bottom_blob->cstep;
      if (local_108 != (int *)0x0) {
        LOCK();
        *local_108 = *local_108 + 1;
        UNLOCK();
        iVar64 = bottom_blob->w;
        iVar45 = bottom_blob->h;
      }
      local_88 = 0;
      _local_e8 = CONCAT44(iVar45 * iVar64,uVar18);
      _uStack_e0 = CONCAT44(uVar19,1);
      local_c8 = (void *)0x0;
      uStack_c0 = 0;
      uStack_bc = 0;
      local_b8 = 0;
      uStack_b4 = 0;
      uStack_b0 = 0;
      local_a8 = (long *)0x0;
      uStack_a0 = 0;
      iStack_9c = 0;
      uStack_98 = 0;
      uStack_94 = 0;
      opt_b.lightmode = local_158->lightmode;
      opt_b._1_3_ = *(undefined3 *)&local_158->field_0x1;
      opt_b.num_threads = local_158->num_threads;
      opt_b.workspace_allocator._0_4_ = *(undefined4 *)&local_158->workspace_allocator;
      opt_b.workspace_allocator._4_4_ = *(undefined4 *)((long)&local_158->workspace_allocator + 4);
      opt_b.openmp_blocktime = local_158->openmp_blocktime;
      opt_b.use_winograd_convolution = local_158->use_winograd_convolution;
      opt_b.use_sgemm_convolution = local_158->use_sgemm_convolution;
      opt_b.use_int8_inference = local_158->use_int8_inference;
      opt_b.use_vulkan_compute = local_158->use_vulkan_compute;
      opt_b.use_bf16_storage = local_158->use_bf16_storage;
      opt_b.use_fp16_packed = local_158->use_fp16_packed;
      opt_b.use_fp16_storage = local_158->use_fp16_storage;
      opt_b.use_fp16_arithmetic = local_158->use_fp16_arithmetic;
      opt_b.use_int8_packed = local_158->use_int8_packed;
      opt_b.use_int8_storage = local_158->use_int8_storage;
      opt_b.use_int8_arithmetic = local_158->use_int8_arithmetic;
      opt_b.use_packing_layout = local_158->use_packing_layout;
      opt_b.use_shader_pack8 = local_158->use_shader_pack8;
      opt_b.use_subgroup_basic = local_158->use_subgroup_basic;
      opt_b.use_subgroup_vote = local_158->use_subgroup_vote;
      opt_b.use_subgroup_ballot = local_158->use_subgroup_ballot;
      opt_b.use_subgroup_shuffle = local_158->use_subgroup_shuffle;
      opt_b.use_image_storage = local_158->use_image_storage;
      opt_b.use_tensor_storage = local_158->use_tensor_storage;
      opt_b.use_reserved_0 = local_158->use_reserved_0;
      opt_b.flush_denormals = local_158->flush_denormals;
      opt_b.use_local_pool_allocator = local_158->use_local_pool_allocator;
      opt_b.use_shader_local_memory = local_158->use_shader_local_memory;
      opt_b.use_cooperative_matrix = local_158->use_cooperative_matrix;
      opt_b.use_winograd23_convolution = local_158->use_winograd23_convolution;
      opt_b.use_winograd43_convolution = local_158->use_winograd43_convolution;
      opt_b.use_winograd63_convolution = local_158->use_winograd63_convolution;
      opt_b.use_a53_a55_optimized_kernel = local_158->use_a53_a55_optimized_kernel;
      opt_b.use_reserved_7 = local_158->use_reserved_7;
      opt_b.use_reserved_8 = local_158->use_reserved_8;
      opt_b.use_reserved_9 = local_158->use_reserved_9;
      opt_b.use_reserved_10 = local_158->use_reserved_10;
      opt_b.use_reserved_11 = local_158->use_reserved_11;
      opt_b.blob_allocator = local_1a8.allocator;
      (*this->gemm->_vptr_Layer[7])();
      pp_Var62 = this->_vptr_Deconvolution_x86;
      p_Var54 = pp_Var62[-3];
      iVar64 = iVar63 * *(int *)(&this->field_0xe8 + (long)p_Var54) -
               *(int *)(&this->field_0xe4 + (long)p_Var54) * uVar37 << bVar55 * '\x02';
      if (bVar55 == 0) {
        uVar52 = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
        lVar35 = (long)local_1a8.h * (long)local_1a8.w;
        uVar44 = (ulong)uVar37;
        if ((int)uVar37 < 1) {
          uVar44 = 0;
        }
        if (iVar67 < 1) {
          iVar67 = 0;
        }
        if (iVar43 < 1) {
          uVar53 = 0;
        }
        local_250 = local_1a8.data;
        for (uVar36 = 0; uVar36 != uVar53; uVar36 = uVar36 + 1) {
          iVar45 = (int)((uVar52 * lVar35 + 0xf & 0xfffffffffffffff0) / uVar52);
          if (local_1a8.dims == 4) {
            iVar45 = (int)lVar35;
          }
          uVar69 = 0;
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var54) != 0) &&
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var54) *
              *(long *)(&this->field_0x1e8 + (long)p_Var54) != 0)) {
            uVar69 = *(undefined4 *)(*(long *)(&this->field_0x1a8 + (long)p_Var54) + uVar36 * 4);
          }
          pfVar59 = (float *)(uVar36 * (long)iStack_9c * CONCAT44(uStack_b4,local_b8) * local_130 +
                             (long)local_c8);
          iVar45 = iVar45 * local_1a8.d;
          if (iVar45 < 1) {
            iVar45 = 0;
          }
          for (lVar41 = 0; iVar45 != (int)lVar41; lVar41 = lVar41 + 1) {
            *(undefined4 *)((long)local_250 + lVar41 * 4) = uVar69;
          }
          p_Var54 = pp_Var62[-3];
          for (iVar45 = 0; iVar45 < *(int *)(&this->field_0xd8 + (long)p_Var54); iVar45 = iVar45 + 1
              ) {
            for (iVar43 = 0; iVar43 < *(int *)(&this->field_0xd4 + (long)p_Var54);
                iVar43 = iVar43 + 1) {
              pfVar42 = (float *)((long)local_1a8.data +
                                 (long)iVar43 * (long)*(int *)(&this->field_0xdc + (long)p_Var54) *
                                 4 + (long)iVar45 *
                                     (long)*(int *)(&this->field_0xe0 + (long)p_Var54) *
                                     (long)local_1a8.w * uVar52 + local_1a8.cstep * uVar52 * uVar36)
              ;
              for (iVar46 = 0; uVar60 = uVar44, iVar46 != iVar67; iVar46 = iVar46 + 1) {
                while ((int)uVar60 != 0) {
                  *pfVar42 = *pfVar42 + *pfVar59;
                  p_Var54 = pp_Var62[-3];
                  pfVar42 = pfVar42 + *(int *)(&this->field_0xe4 + (long)p_Var54);
                  pfVar59 = pfVar59 + 1;
                  uVar60 = (ulong)((int)uVar60 - 1);
                }
                pfVar42 = pfVar42 + iVar64;
              }
            }
          }
          local_250 = (void *)((long)local_250 + local_1a8.cstep * uVar52);
        }
      }
      else {
        uVar52 = (ulong)uVar37;
        if ((int)uVar37 < 1) {
          uVar52 = 0;
        }
        if (iVar67 < 1) {
          iVar67 = 0;
        }
        if (iVar43 < 1) {
          uVar53 = 0;
        }
        for (uVar44 = 0; uVar44 != uVar53; uVar44 = uVar44 + 1) {
          pfVar59 = (float *)((long)iStack_9c * uVar44 * local_130 * CONCAT44(uStack_b4,local_b8) +
                             (long)local_c8);
          uVar36 = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize);
          puVar61 = (undefined8 *)(local_1a8.cstep * uVar44 * uVar36 + (long)local_1a8.data);
          uVar39 = (long)local_1a8.h * (long)local_1a8.w;
          uVar60 = (uVar36 * uVar39 + 0xf & 0xfffffffffffffff0) / uVar36;
          if (local_1a8.dims == 4) {
            uVar60 = uVar39;
          }
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var54) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var54) *
              *(long *)(&this->field_0x1e8 + (long)p_Var54) == 0)) {
            iVar45 = local_1a8.d * (int)uVar60;
            puVar31 = puVar61;
            if (iVar45 < 1) {
              iVar45 = 0;
            }
            while (iVar45 != 0) {
              *puVar31 = 0;
              puVar31[1] = 0;
              puVar31 = puVar31 + 2;
              iVar45 = iVar45 + -1;
            }
          }
          else {
            puVar1 = (undefined4 *)(*(long *)(&this->field_0x1a8 + (long)p_Var54) + uVar44 * 0x10);
            uVar69 = *puVar1;
            uVar4 = puVar1[1];
            uVar16 = puVar1[2];
            uVar17 = puVar1[3];
            iVar45 = local_1a8.d * (int)uVar60;
            puVar31 = puVar61;
            if (iVar45 < 1) {
              iVar45 = 0;
            }
            while (iVar45 != 0) {
              *(undefined4 *)puVar31 = uVar69;
              *(undefined4 *)((long)puVar31 + 4) = uVar4;
              *(undefined4 *)(puVar31 + 1) = uVar16;
              *(undefined4 *)((long)puVar31 + 0xc) = uVar17;
              puVar31 = puVar31 + 2;
              iVar45 = iVar45 + -1;
            }
          }
          p_Var54 = pp_Var62[-3];
          for (iVar45 = 0; iVar45 < *(int *)(&this->field_0xd8 + (long)p_Var54); iVar45 = iVar45 + 1
              ) {
            for (iVar43 = 0; iVar43 < *(int *)(&this->field_0xd4 + (long)p_Var54);
                iVar43 = iVar43 + 1) {
              pfVar42 = (float *)((long)puVar61 +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var54) * iVar43 * 4) *
                                 4 + (long)iVar45 *
                                     (long)*(int *)(&this->field_0xe0 + (long)p_Var54) *
                                     uVar36 * (long)local_1a8.w);
              for (iVar46 = 0; uVar60 = uVar52, iVar46 != iVar67; iVar46 = iVar46 + 1) {
                while ((int)uVar60 != 0) {
                  fVar88 = pfVar59[1];
                  fVar89 = pfVar59[2];
                  fVar90 = pfVar59[3];
                  *pfVar42 = *pfVar59 + *pfVar42;
                  pfVar42[1] = fVar88 + pfVar42[1];
                  pfVar42[2] = fVar89 + pfVar42[2];
                  pfVar42[3] = fVar90 + pfVar42[3];
                  p_Var54 = pp_Var62[-3];
                  pfVar42 = pfVar42 + (long)*(int *)(&this->field_0xe4 + (long)p_Var54) * 4;
                  pfVar59 = pfVar59 + 4;
                  uVar60 = (ulong)((int)uVar60 - 1);
                }
                pfVar42 = pfVar42 + iVar64;
              }
            }
          }
        }
      }
      pLVar7 = this->activation;
      if (pLVar7 != (Layer *)0x0) {
        (*pLVar7->_vptr_Layer[9])(pLVar7,&local_1a8,local_158);
      }
      piVar8 = (int *)CONCAT44(uStack_bc,uStack_c0);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_a8 == (long *)0x0) {
            free(local_c8);
          }
          else {
            (**(code **)(*local_a8 + 0x18))();
          }
        }
      }
      if (local_108 != (int *)0x0) {
        LOCK();
        *local_108 = *local_108 + -1;
        UNLOCK();
        if (*local_108 == 0) {
          if (local_f0 == (Allocator *)0x0) {
            free(local_110);
          }
          else {
            (*local_f0->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      bVar55 = bVar55 ^ 1;
      if ((int)local_140 == 4 && bVar55 == 0) {
        iVar64 = *(int *)(&this->field_0xdc + (long)p_Var54);
        iVar67 = *(int *)(&this->field_0xe0 + (long)p_Var54);
        iVar45 = *(int *)(&this->field_0xe4 + (long)p_Var54);
        iVar43 = *(int *)(&this->field_0xe8 + (long)p_Var54);
        iVar46 = *(int *)(&this->field_0x114 + (long)p_Var54);
        lVar35 = *(long *)(&this->field_0x1a8 + (long)p_Var54);
        uVar52 = 0;
        if (0 < (int)uVar65) {
          uVar52 = (ulong)uVar65;
        }
        uVar44 = 0;
        if (0 < (int)uVar28) {
          uVar44 = (ulong)uVar28;
        }
        local_150 = (_func_int *)(ulong)(uint)local_1a8.c;
        if (local_1a8.c < 1) {
          local_150 = (_func_int *)0x0;
        }
        fVar88 = (float)DAT_004edaa0;
        fVar89 = DAT_004edaa0._4_4_;
        fVar90 = DAT_004edaa0._8_4_;
        fVar91 = DAT_004edaa0._12_4_;
        for (p_Var49 = (_func_int *)0x0; p_Var49 != local_150; p_Var49 = p_Var49 + 1) {
          pauVar32 = (undefined1 (*) [16])
                     (local_1a8.cstep * (long)p_Var49 *
                      CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize) +
                     (long)local_1a8.data);
          iVar56 = bottom_blob->w;
          iVar63 = bottom_blob->h;
          uVar36 = 0;
          uVar53 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar53 = uVar36;
          }
          uVar37 = local_1a8.w;
          if (local_1a8.w < 1) {
            uVar37 = 0;
          }
          uVar47 = local_1a8.h;
          if (local_1a8.h < 1) {
            uVar47 = 0;
          }
          while (uVar48 = (uint)uVar36, uVar48 != uVar47) {
            iVar30 = (1 - uVar65) * iVar64;
            for (uVar38 = 0; auVar96 = ZEXT816(0), uVar38 != uVar37; uVar38 = uVar38 + 1) {
              if (lVar35 == 0) {
                auVar71 = ZEXT816(0);
              }
              else {
                auVar71 = *(undefined1 (*) [16])(lVar35 + (long)p_Var49 * 0x10);
              }
              pvVar40 = bottom_blob->data;
              lVar41 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * (long)p_Var49 *
                       (this->weight_data_tm).elemsize + 0x30;
              for (uVar36 = 0; uVar36 != uVar53; uVar36 = uVar36 + 1) {
                lVar57 = lVar41;
                for (uVar60 = 0; uVar60 != uVar44; uVar60 = uVar60 + 1) {
                  iVar26 = (((int)uVar60 - uVar28) + 1) * iVar67 + uVar48;
                  if (((-1 < iVar26) && (iVar27 = iVar26 / iVar43, iVar26 % iVar43 == 0)) &&
                     (iVar27 < iVar63)) {
                    lVar24 = (long)iVar27 * (long)bottom_blob->w * bottom_blob->elemsize +
                             bottom_blob->cstep * bottom_blob->elemsize * uVar36;
                    iVar26 = iVar30;
                    for (lVar68 = 0; uVar52 * 0x40 != lVar68; lVar68 = lVar68 + 0x40) {
                      if (((-1 < iVar26) && (iVar27 = iVar26 / iVar45, iVar26 % iVar45 == 0)) &&
                         (iVar27 < iVar56)) {
                        lVar33 = (long)(iVar27 << 2);
                        fVar80 = *(float *)((long)pvVar40 + lVar33 * 4 + lVar24);
                        fVar93 = *(float *)((long)pvVar40 + lVar33 * 4 + lVar24 + 4);
                        pfVar42 = (float *)(lVar57 + -0x30 + lVar68);
                        fVar105 = *(float *)((long)pvVar40 + lVar33 * 4 + lVar24 + 8);
                        fVar107 = auVar71._4_4_;
                        fVar108 = auVar71._8_4_;
                        fVar92 = auVar71._12_4_;
                        fVar106 = *(float *)((long)pvVar40 + lVar33 * 4 + lVar24 + 0xc);
                        pfVar2 = (float *)(lVar57 + -0x20 + lVar68);
                        pfVar3 = (float *)(lVar57 + -0x10 + lVar68);
                        pfVar59 = (float *)(lVar57 + lVar68);
                        auVar71._0_4_ =
                             fVar106 * *pfVar59 +
                             fVar105 * *pfVar3 + fVar93 * *pfVar2 +
                             fVar80 * *pfVar42 + auVar71._0_4_;
                        auVar71._4_4_ =
                             fVar106 * pfVar59[1] +
                             fVar105 * pfVar3[1] + fVar93 * pfVar2[1] +
                             fVar80 * pfVar42[1] + fVar107;
                        auVar71._8_4_ =
                             fVar106 * pfVar59[2] +
                             fVar105 * pfVar3[2] + fVar93 * pfVar2[2] +
                             fVar80 * pfVar42[2] + fVar108;
                        auVar71._12_4_ =
                             fVar106 * pfVar59[3] +
                             fVar105 * pfVar3[3] + fVar93 * pfVar2[3] + fVar80 * pfVar42[3] + fVar92
                        ;
                      }
                      iVar26 = iVar26 + iVar64;
                    }
                  }
                  lVar57 = lVar57 + (long)(int)uVar65 * 0x40;
                }
                lVar41 = lVar41 + (long)(int)(uVar65 * uVar28 * 0x10) * 4;
              }
              fVar80 = auVar71._8_4_;
              fVar93 = auVar71._12_4_;
              if (5 < iVar46 - 1U) goto LAB_0025097a;
              auVar94 = maxps(auVar71,auVar96);
              auVar72 = auVar94;
              switch(iVar46) {
              case 2:
                auVar96 = minps(auVar71,auVar96);
                fVar80 = **(float **)(&this->field_0x118 + (long)p_Var54);
                auVar72._0_4_ = auVar94._0_4_ + fVar80 * auVar96._0_4_;
                auVar72._4_4_ = auVar94._4_4_ + fVar80 * auVar96._4_4_;
                auVar72._8_4_ = auVar94._8_4_ + fVar80 * auVar96._8_4_;
                auVar72._12_4_ = auVar94._12_4_ + fVar80 * auVar96._12_4_;
                break;
              case 3:
                uVar69 = **(undefined4 **)(&this->field_0x118 + (long)p_Var54);
                uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var54))[1];
                auVar83._4_4_ = uVar69;
                auVar83._0_4_ = uVar69;
                auVar83._8_4_ = uVar69;
                auVar83._12_4_ = uVar69;
                auVar95._4_4_ = uVar4;
                auVar95._0_4_ = uVar4;
                auVar95._8_4_ = uVar4;
                auVar95._12_4_ = uVar4;
                auVar96 = maxps(auVar71,auVar83);
                auVar72 = minps(auVar96,auVar95);
                break;
              case 4:
                auVar73._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
                auVar73._8_4_ = -fVar80;
                auVar73._12_4_ = -fVar93;
                auVar96 = minps(auVar73,auVar78);
                auVar96 = maxps(auVar96,auVar79);
                fVar93 = auVar96._0_4_ * 1.442695 + 0.5;
                fVar106 = auVar96._4_4_ * 1.442695 + 0.5;
                fVar108 = auVar96._8_4_ * 1.442695 + 0.5;
                fVar102 = auVar96._12_4_ * 1.442695 + 0.5;
                fVar80 = (float)(int)fVar93;
                fVar105 = (float)(int)fVar106;
                fVar107 = (float)(int)fVar108;
                fVar92 = (float)(int)fVar102;
                fVar80 = fVar80 - (float)(-(uint)(fVar93 < fVar80) & (uint)fVar88);
                fVar105 = fVar105 - (float)(-(uint)(fVar106 < fVar105) & (uint)fVar89);
                fVar107 = fVar107 - (float)(-(uint)(fVar108 < fVar107) & (uint)fVar90);
                fVar92 = fVar92 - (float)(-(uint)(fVar102 < fVar92) & (uint)fVar91);
                fVar93 = fVar80 * -0.6931472 + auVar96._0_4_;
                fVar106 = fVar105 * -0.6931472 + auVar96._4_4_;
                fVar108 = fVar107 * -0.6931472 + auVar96._8_4_;
                fVar102 = fVar92 * -0.6931472 + auVar96._12_4_;
                auVar74._0_4_ = fVar93 * fVar93;
                auVar74._4_4_ = fVar106 * fVar106;
                auVar74._8_4_ = fVar108 * fVar108;
                auVar74._12_4_ = fVar102 * fVar102;
                fVar103 = (float)((int)fVar80 * 0x800000 + (int)fVar88) *
                          (fVar93 + fVar88 +
                          (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) *
                             fVar93 + 0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5) *
                          auVar74._0_4_) + fVar88;
                fVar104 = (float)((int)fVar105 * 0x800000 + (int)fVar89) *
                          (fVar106 + fVar89 +
                          (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) *
                             fVar106 + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) *
                          auVar74._4_4_) + fVar89;
                fVar107 = (float)((int)fVar107 * 0x800000 + (int)fVar90) *
                          (fVar108 + fVar90 +
                          (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) *
                             fVar108 + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) *
                          auVar74._8_4_) + fVar90;
                fVar108 = (float)((int)fVar92 * 0x800000 + (int)fVar91) *
                          (fVar102 + fVar91 +
                          (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                             fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                          auVar74._12_4_) + fVar91;
                auVar12._4_4_ = fVar104;
                auVar12._0_4_ = fVar103;
                auVar12._8_4_ = fVar107;
                auVar12._12_4_ = fVar108;
                auVar96 = rcpps(auVar74,auVar12);
                fVar80 = auVar96._0_4_;
                fVar93 = auVar96._4_4_;
                fVar105 = auVar96._8_4_;
                fVar106 = auVar96._12_4_;
                auVar72._0_4_ = (fVar88 - fVar103 * fVar80) * fVar80 + fVar80;
                auVar72._4_4_ = (fVar89 - fVar104 * fVar93) * fVar93 + fVar93;
                auVar72._8_4_ = (fVar90 - fVar107 * fVar105) * fVar105 + fVar105;
                auVar72._12_4_ = (fVar91 - fVar108 * fVar106) * fVar106 + fVar106;
                break;
              case 5:
                auVar96 = minps(auVar71,auVar78);
                auVar96 = maxps(auVar96,auVar79);
                fVar105 = auVar96._0_4_ * 1.442695 + 0.5;
                fVar106 = auVar96._4_4_ * 1.442695 + 0.5;
                fVar107 = auVar96._8_4_ * 1.442695 + 0.5;
                fVar108 = auVar96._12_4_ * 1.442695 + 0.5;
                fVar92 = (float)(int)fVar105;
                fVar102 = (float)(int)fVar106;
                fVar103 = (float)(int)fVar107;
                fVar104 = (float)(int)fVar108;
                fVar92 = fVar92 - (float)(-(uint)(fVar105 < fVar92) & (uint)fVar88);
                fVar102 = fVar102 - (float)(-(uint)(fVar106 < fVar102) & (uint)fVar89);
                fVar103 = fVar103 - (float)(-(uint)(fVar107 < fVar103) & (uint)fVar90);
                fVar104 = fVar104 - (float)(-(uint)(fVar108 < fVar104) & (uint)fVar91);
                fVar105 = auVar96._0_4_ - fVar92 * 0.6931472;
                fVar106 = auVar96._4_4_ - fVar102 * 0.6931472;
                fVar107 = auVar96._8_4_ - fVar103 * 0.6931472;
                fVar108 = auVar96._12_4_ - fVar104 * 0.6931472;
                auVar109._0_4_ =
                     (float)((int)fVar92 * 0x800000 + (int)fVar88) *
                     (fVar105 + fVar88 +
                     (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105
                       + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) * fVar105 * fVar105)
                     + fVar88;
                auVar109._4_4_ =
                     (float)((int)fVar102 * 0x800000 + (int)fVar89) *
                     (fVar106 + fVar89 +
                     (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106
                       + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) * fVar106 * fVar106)
                     + fVar89;
                auVar109._8_4_ =
                     (float)((int)fVar103 * 0x800000 + (int)fVar90) *
                     (fVar107 + fVar90 +
                     (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107
                       + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) * fVar107 * fVar107)
                     + fVar90;
                auVar109._12_4_ =
                     (float)((int)fVar104 * 0x800000 + (int)fVar91) *
                     (fVar108 + fVar91 +
                     (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108
                       + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) * fVar108 * fVar108)
                     + fVar91;
                auVar96 = maxps(auVar109,_DAT_004edb10);
                fVar105 = (float)(auVar96._0_4_ & 0x807fffff | 0x3f000000);
                fVar107 = (float)(auVar96._4_4_ & 0x807fffff | 0x3f000000);
                fVar92 = (float)(auVar96._8_4_ & 0x807fffff | 0x3f000000);
                fVar103 = (float)(auVar96._12_4_ & 0x807fffff | 0x3f000000);
                fVar106 = fVar105 + -1.0 + (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar105);
                fVar108 = fVar107 + -1.0 + (float)(-(uint)(fVar107 < 0.70710677) & (uint)fVar107);
                fVar102 = fVar92 + -1.0 + (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar92);
                fVar104 = fVar103 + -1.0 + (float)(-(uint)(fVar103 < 0.70710677) & (uint)fVar103);
                auVar81._0_8_ =
                     CONCAT44(-(uint)(auVar109._4_4_ <= 0.0),-(uint)(auVar109._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar81._8_4_ = -(uint)(auVar109._8_4_ <= 0.0) & 0x7fffffff;
                auVar81._12_4_ = -(uint)(auVar109._12_4_ <= 0.0) & 0x7fffffff;
                auVar9._4_4_ = ~-(uint)(auVar109._4_4_ <= 0.0) &
                               (uint)((((float)(int)((auVar96._4_4_ >> 0x17) - 0x7e) -
                                       (float)(-(uint)(fVar107 < 0.70710677) & (uint)fVar89)) *
                                       DAT_004edab0._4_4_ + fVar108 +
                                      (((((((((fVar108 * 0.070376836 + -0.1151461) * fVar108 +
                                             0.116769984) * fVar108 + -0.12420141) * fVar108 +
                                           0.14249323) * fVar108 + -0.16668057) * fVar108 +
                                         0.20000714) * fVar108 + -0.24999994) * fVar108 + 0.3333333)
                                       * fVar108 + -0.5) * fVar108 * fVar108) * -2.0);
                auVar9._0_4_ = ~-(uint)(auVar109._0_4_ <= 0.0) &
                               (uint)((((float)(int)((auVar96._0_4_ >> 0x17) - 0x7e) -
                                       (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar88)) *
                                       (float)DAT_004edab0 + fVar106 +
                                      (((((((((fVar106 * 0.070376836 + -0.1151461) * fVar106 +
                                             0.116769984) * fVar106 + -0.12420141) * fVar106 +
                                           0.14249323) * fVar106 + -0.16668057) * fVar106 +
                                         0.20000714) * fVar106 + -0.24999994) * fVar106 + 0.3333333)
                                       * fVar106 + -0.5) * fVar106 * fVar106) * -2.0);
                auVar9._8_4_ = ~-(uint)(auVar109._8_4_ <= 0.0) &
                               (uint)((((float)(int)((auVar96._8_4_ >> 0x17) - 0x7e) -
                                       (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar90)) *
                                       DAT_004edab0._8_4_ + fVar102 +
                                      (((((((((fVar102 * 0.070376836 + -0.1151461) * fVar102 +
                                             0.116769984) * fVar102 + -0.12420141) * fVar102 +
                                           0.14249323) * fVar102 + -0.16668057) * fVar102 +
                                         0.20000714) * fVar102 + -0.24999994) * fVar102 + 0.3333333)
                                       * fVar102 + -0.5) * fVar102 * fVar102) * -2.0);
                auVar9._12_4_ =
                     ~-(uint)(auVar109._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar96._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar103 < 0.70710677) & (uint)fVar91)) *
                             DAT_004edab0._12_4_ + fVar104 +
                            (((((((((fVar104 * 0.070376836 + -0.1151461) * fVar104 + 0.116769984) *
                                   fVar104 + -0.12420141) * fVar104 + 0.14249323) * fVar104 +
                                -0.16668057) * fVar104 + 0.20000714) * fVar104 + -0.24999994) *
                              fVar104 + 0.3333333) * fVar104 + -0.5) * fVar104 * fVar104) * -2.0);
                auVar96 = minps(auVar81 | auVar9,auVar78);
                auVar96 = maxps(auVar96,auVar79);
                fVar105 = auVar96._0_4_ * 1.442695 + 0.5;
                fVar106 = auVar96._4_4_ * 1.442695 + 0.5;
                fVar107 = auVar96._8_4_ * 1.442695 + 0.5;
                fVar108 = auVar96._12_4_ * 1.442695 + 0.5;
                fVar92 = (float)(int)fVar105;
                fVar102 = (float)(int)fVar106;
                fVar103 = (float)(int)fVar107;
                fVar104 = (float)(int)fVar108;
                fVar92 = fVar92 - (float)(-(uint)(fVar105 < fVar92) & (uint)fVar88);
                fVar102 = fVar102 - (float)(-(uint)(fVar106 < fVar102) & (uint)fVar89);
                fVar103 = fVar103 - (float)(-(uint)(fVar107 < fVar103) & (uint)fVar90);
                fVar104 = fVar104 - (float)(-(uint)(fVar108 < fVar104) & (uint)fVar91);
                fVar105 = auVar96._0_4_ - fVar92 * (float)DAT_004edab0;
                fVar106 = auVar96._4_4_ - fVar102 * DAT_004edab0._4_4_;
                fVar107 = auVar96._8_4_ - fVar103 * DAT_004edab0._8_4_;
                fVar108 = auVar96._12_4_ - fVar104 * DAT_004edab0._12_4_;
                auVar82._0_4_ =
                     fVar105 + fVar88 +
                     (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105
                       + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) * fVar105 * fVar105;
                auVar82._4_4_ =
                     fVar106 + fVar89 +
                     (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106
                       + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) * fVar106 * fVar106;
                auVar82._8_4_ =
                     fVar107 + fVar90 +
                     (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107
                       + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) * fVar107 * fVar107;
                auVar82._12_4_ =
                     fVar108 + fVar91 +
                     (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108
                       + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) * fVar108 * fVar108;
                fVar92 = (float)((int)fVar92 * 0x800000 + (int)fVar88) * auVar82._0_4_ + fVar88;
                fVar102 = (float)((int)fVar102 * 0x800000 + (int)fVar89) * auVar82._4_4_ + fVar89;
                fVar103 = (float)((int)fVar103 * 0x800000 + (int)fVar90) * auVar82._8_4_ + fVar90;
                fVar104 = (float)((int)fVar104 * 0x800000 + (int)fVar91) * auVar82._12_4_ + fVar91;
                auVar11._4_4_ = fVar102;
                auVar11._0_4_ = fVar92;
                auVar11._8_4_ = fVar103;
                auVar11._12_4_ = fVar104;
                auVar96 = rcpps(auVar82,auVar11);
                fVar105 = auVar96._0_4_;
                fVar106 = auVar96._4_4_;
                fVar107 = auVar96._8_4_;
                fVar108 = auVar96._12_4_;
                auVar96._0_4_ =
                     fVar105 + fVar105 + -1.0 + (2.0 - fVar92 * (fVar105 + fVar105)) * fVar105;
                auVar96._4_4_ =
                     fVar106 + fVar106 + -1.0 + (2.0 - fVar102 * (fVar106 + fVar106)) * fVar106;
                auVar96._8_4_ =
                     fVar107 + fVar107 + -1.0 + (2.0 - fVar103 * (fVar107 + fVar107)) * fVar107;
                auVar96._12_4_ =
                     fVar108 + fVar108 + -1.0 + (2.0 - fVar104 * (fVar108 + fVar108)) * fVar108;
                goto LAB_00250972;
              case 6:
                fVar105 = **(float **)(&this->field_0x118 + (long)p_Var54);
                fVar106 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                auVar94._0_4_ = fVar105 * auVar71._0_4_ + fVar106;
                auVar94._4_4_ = fVar105 * auVar71._4_4_ + fVar106;
                auVar94._8_4_ = fVar105 * fVar80 + fVar106;
                auVar94._12_4_ = fVar105 * fVar93 + fVar106;
                auVar96 = maxps(auVar94,auVar96);
                auVar96 = minps(auVar96,auVar70);
LAB_00250972:
                auVar72._0_4_ = auVar96._0_4_ * auVar71._0_4_;
                auVar72._4_4_ = auVar96._4_4_ * auVar71._4_4_;
                auVar72._8_4_ = auVar96._8_4_ * fVar80;
                auVar72._12_4_ = auVar96._12_4_ * fVar93;
              }
              auVar71 = auVar72;
LAB_0025097a:
              *pauVar32 = auVar71;
              pauVar32 = pauVar32 + 1;
              iVar30 = iVar30 + 1;
            }
            uVar36 = (ulong)(uVar48 + 1);
          }
        }
      }
      auVar70 = _DAT_004edaa0;
      auVar79 = _DAT_004eda70;
      auVar78 = _DAT_004eda60;
      if ((int)local_140 == 1 && bVar55 == 0) {
        p_Var54 = pp_Var62[-3];
        uVar37 = *(uint *)(&this->field_0xd4 + (long)p_Var54);
        uVar65 = *(uint *)(&this->field_0xd8 + (long)p_Var54);
        iVar64 = *(int *)(&this->field_0xdc + (long)p_Var54);
        iVar67 = *(int *)(&this->field_0xe0 + (long)p_Var54);
        iVar45 = *(int *)(&this->field_0xe4 + (long)p_Var54);
        iVar43 = *(int *)(&this->field_0xe8 + (long)p_Var54);
        iVar46 = *(int *)(&this->field_0x114 + (long)p_Var54);
        lVar35 = *(long *)(&this->field_0x1a8 + (long)p_Var54);
        uVar52 = 0;
        if (0 < (int)uVar37) {
          uVar52 = (ulong)uVar37;
        }
        uVar44 = 0;
        if (0 < (int)uVar65) {
          uVar44 = (ulong)uVar65;
        }
        local_150 = (_func_int *)(ulong)(uint)local_1a8.c;
        if (local_1a8.c < 1) {
          local_150 = (_func_int *)0x0;
        }
        fVar88 = (float)DAT_004edaa0;
        fVar89 = DAT_004edaa0._4_4_;
        fVar90 = DAT_004edaa0._8_4_;
        fVar91 = DAT_004edaa0._12_4_;
        for (p_Var49 = (_func_int *)0x0; p_Var49 != local_150; p_Var49 = p_Var49 + 1) {
          local_260 = (undefined1 (*) [16])
                      (local_1a8.cstep * (long)p_Var49 *
                       CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize) +
                      (long)local_1a8.data);
          iVar56 = bottom_blob->w;
          iVar63 = bottom_blob->h;
          uVar36 = 0;
          uVar53 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar53 = uVar36;
          }
          uVar28 = local_1a8.w;
          if (local_1a8.w < 1) {
            uVar28 = 0;
          }
          uVar47 = local_1a8.h;
          if (local_1a8.h < 1) {
            uVar47 = 0;
          }
          while (uVar48 = (uint)uVar36, uVar48 != uVar47) {
            iVar30 = (1 - uVar37) * iVar64;
            for (uVar38 = 0; auVar96 = ZEXT816(0), uVar38 != uVar28; uVar38 = uVar38 + 1) {
              if (lVar35 == 0) {
                auVar71 = ZEXT816(0);
              }
              else {
                auVar71 = *(undefined1 (*) [16])(lVar35 + (long)p_Var49 * 0x10);
              }
              pvVar40 = (void *)((this->weight_data_tm).cstep * (long)p_Var49 *
                                 (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data
                                );
              for (uVar36 = 0; uVar36 != uVar53; uVar36 = uVar36 + 1) {
                pvVar51 = pvVar40;
                for (uVar60 = 0; uVar60 != uVar44; uVar60 = uVar60 + 1) {
                  iVar26 = (((int)uVar60 - uVar65) + 1) * iVar67 + uVar48;
                  if (((-1 < iVar26) && (iVar27 = iVar26 / iVar43, iVar26 % iVar43 == 0)) &&
                     (iVar27 < iVar63)) {
                    iVar26 = iVar30;
                    for (lVar41 = 0; uVar52 * 0x10 != lVar41; lVar41 = lVar41 + 0x10) {
                      auVar75 = auVar71;
                      if (((-1 < iVar26) && (iVar29 = iVar26 / iVar45, iVar26 % iVar45 == 0)) &&
                         (iVar29 < iVar56)) {
                        fVar80 = *(float *)((long)bottom_blob->data +
                                           (long)iVar29 * 4 +
                                           (long)iVar27 *
                                           (long)bottom_blob->w * bottom_blob->elemsize +
                                           bottom_blob->cstep * bottom_blob->elemsize * uVar36);
                        pfVar59 = (float *)((long)pvVar51 + lVar41);
                        auVar75._0_4_ = auVar71._0_4_ + fVar80 * *pfVar59;
                        auVar75._4_4_ = auVar71._4_4_ + fVar80 * pfVar59[1];
                        auVar75._8_4_ = auVar71._8_4_ + fVar80 * pfVar59[2];
                        auVar75._12_4_ = auVar71._12_4_ + fVar80 * pfVar59[3];
                      }
                      iVar26 = iVar26 + iVar64;
                      auVar71 = auVar75;
                    }
                  }
                  pvVar51 = (void *)((long)pvVar51 + (long)(int)uVar37 * 0x10);
                }
                pvVar40 = (void *)((long)pvVar40 + (long)(int)(uVar37 * uVar65 * 4) * 4);
              }
              auVar97 = auVar71;
              if (5 < iVar46 - 1U) goto switchD_00250d0e_caseD_1;
              fVar80 = auVar71._8_4_;
              fVar93 = auVar71._12_4_;
              auVar97 = maxps(auVar71,auVar96);
              switch(iVar46) {
              case 2:
                auVar96 = minps(auVar71,auVar96);
                fVar80 = **(float **)(&this->field_0x118 + (long)p_Var54);
                auVar98._0_4_ = auVar97._0_4_ + fVar80 * auVar96._0_4_;
                auVar98._4_4_ = auVar97._4_4_ + fVar80 * auVar96._4_4_;
                auVar98._8_4_ = auVar97._8_4_ + fVar80 * auVar96._8_4_;
                auVar98._12_4_ = auVar97._12_4_ + fVar80 * auVar96._12_4_;
                auVar97 = auVar98;
                break;
              case 3:
                uVar69 = **(undefined4 **)(&this->field_0x118 + (long)p_Var54);
                uVar4 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var54))[1];
                auVar86._4_4_ = uVar69;
                auVar86._0_4_ = uVar69;
                auVar86._8_4_ = uVar69;
                auVar86._12_4_ = uVar69;
                auVar99._4_4_ = uVar4;
                auVar99._0_4_ = uVar4;
                auVar99._8_4_ = uVar4;
                auVar99._12_4_ = uVar4;
                auVar96 = maxps(auVar71,auVar86);
                auVar97 = minps(auVar96,auVar99);
                break;
              case 4:
                auVar76._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
                auVar76._8_4_ = -fVar80;
                auVar76._12_4_ = -fVar93;
                auVar96 = minps(auVar76,auVar78);
                auVar96 = maxps(auVar96,auVar79);
                fVar93 = auVar96._0_4_ * 1.442695 + 0.5;
                fVar106 = auVar96._4_4_ * 1.442695 + 0.5;
                fVar108 = auVar96._8_4_ * 1.442695 + 0.5;
                fVar102 = auVar96._12_4_ * 1.442695 + 0.5;
                fVar80 = (float)(int)fVar93;
                fVar105 = (float)(int)fVar106;
                fVar107 = (float)(int)fVar108;
                fVar92 = (float)(int)fVar102;
                fVar80 = fVar80 - (float)(-(uint)(fVar93 < fVar80) & (uint)fVar88);
                fVar105 = fVar105 - (float)(-(uint)(fVar106 < fVar105) & (uint)fVar89);
                fVar107 = fVar107 - (float)(-(uint)(fVar108 < fVar107) & (uint)fVar90);
                fVar92 = fVar92 - (float)(-(uint)(fVar102 < fVar92) & (uint)fVar91);
                fVar93 = fVar80 * -0.6931472 + auVar96._0_4_;
                fVar106 = fVar105 * -0.6931472 + auVar96._4_4_;
                fVar108 = fVar107 * -0.6931472 + auVar96._8_4_;
                fVar102 = fVar92 * -0.6931472 + auVar96._12_4_;
                auVar77._0_4_ = fVar93 * fVar93;
                auVar77._4_4_ = fVar106 * fVar106;
                auVar77._8_4_ = fVar108 * fVar108;
                auVar77._12_4_ = fVar102 * fVar102;
                fVar103 = (float)((int)fVar80 * 0x800000 + (int)fVar88) *
                          (fVar93 + fVar88 +
                          (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) *
                             fVar93 + 0.041665796) * fVar93 + 0.16666666) * fVar93 + 0.5) *
                          auVar77._0_4_) + fVar88;
                fVar104 = (float)((int)fVar105 * 0x800000 + (int)fVar89) *
                          (fVar106 + fVar89 +
                          (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) *
                             fVar106 + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) *
                          auVar77._4_4_) + fVar89;
                fVar107 = (float)((int)fVar107 * 0x800000 + (int)fVar90) *
                          (fVar108 + fVar90 +
                          (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) *
                             fVar108 + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) *
                          auVar77._8_4_) + fVar90;
                fVar108 = (float)((int)fVar92 * 0x800000 + (int)fVar91) *
                          (fVar102 + fVar91 +
                          (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                             fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                          auVar77._12_4_) + fVar91;
                auVar14._4_4_ = fVar104;
                auVar14._0_4_ = fVar103;
                auVar14._8_4_ = fVar107;
                auVar14._12_4_ = fVar108;
                auVar96 = rcpps(auVar77,auVar14);
                fVar80 = auVar96._0_4_;
                fVar93 = auVar96._4_4_;
                fVar105 = auVar96._8_4_;
                fVar106 = auVar96._12_4_;
                auVar97._0_4_ = (fVar88 - fVar103 * fVar80) * fVar80 + fVar80;
                auVar97._4_4_ = (fVar89 - fVar104 * fVar93) * fVar93 + fVar93;
                auVar97._8_4_ = (fVar90 - fVar107 * fVar105) * fVar105 + fVar105;
                auVar97._12_4_ = (fVar91 - fVar108 * fVar106) * fVar106 + fVar106;
                break;
              case 5:
                auVar96 = minps(auVar71,auVar78);
                auVar96 = maxps(auVar96,auVar79);
                fVar105 = auVar96._0_4_ * 1.442695 + 0.5;
                fVar106 = auVar96._4_4_ * 1.442695 + 0.5;
                fVar107 = auVar96._8_4_ * 1.442695 + 0.5;
                fVar108 = auVar96._12_4_ * 1.442695 + 0.5;
                fVar92 = (float)(int)fVar105;
                fVar102 = (float)(int)fVar106;
                fVar103 = (float)(int)fVar107;
                fVar104 = (float)(int)fVar108;
                fVar92 = fVar92 - (float)(-(uint)(fVar105 < fVar92) & (uint)fVar88);
                fVar102 = fVar102 - (float)(-(uint)(fVar106 < fVar102) & (uint)fVar89);
                fVar103 = fVar103 - (float)(-(uint)(fVar107 < fVar103) & (uint)fVar90);
                fVar104 = fVar104 - (float)(-(uint)(fVar108 < fVar104) & (uint)fVar91);
                fVar105 = auVar96._0_4_ - fVar92 * 0.6931472;
                fVar106 = auVar96._4_4_ - fVar102 * 0.6931472;
                fVar107 = auVar96._8_4_ - fVar103 * 0.6931472;
                fVar108 = auVar96._12_4_ - fVar104 * 0.6931472;
                auVar110._0_4_ =
                     (float)((int)fVar92 * 0x800000 + (int)fVar88) *
                     (fVar105 + fVar88 +
                     (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105
                       + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) * fVar105 * fVar105)
                     + fVar88;
                auVar110._4_4_ =
                     (float)((int)fVar102 * 0x800000 + (int)fVar89) *
                     (fVar106 + fVar89 +
                     (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106
                       + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) * fVar106 * fVar106)
                     + fVar89;
                auVar110._8_4_ =
                     (float)((int)fVar103 * 0x800000 + (int)fVar90) *
                     (fVar107 + fVar90 +
                     (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107
                       + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) * fVar107 * fVar107)
                     + fVar90;
                auVar110._12_4_ =
                     (float)((int)fVar104 * 0x800000 + (int)fVar91) *
                     (fVar108 + fVar91 +
                     (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108
                       + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) * fVar108 * fVar108)
                     + fVar91;
                auVar96 = maxps(auVar110,_DAT_004edb10);
                fVar105 = (float)(auVar96._0_4_ & 0x807fffff | 0x3f000000);
                fVar107 = (float)(auVar96._4_4_ & 0x807fffff | 0x3f000000);
                fVar92 = (float)(auVar96._8_4_ & 0x807fffff | 0x3f000000);
                fVar103 = (float)(auVar96._12_4_ & 0x807fffff | 0x3f000000);
                fVar106 = fVar105 + -1.0 + (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar105);
                fVar108 = fVar107 + -1.0 + (float)(-(uint)(fVar107 < 0.70710677) & (uint)fVar107);
                fVar102 = fVar92 + -1.0 + (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar92);
                fVar104 = fVar103 + -1.0 + (float)(-(uint)(fVar103 < 0.70710677) & (uint)fVar103);
                auVar84._0_8_ =
                     CONCAT44(-(uint)(auVar110._4_4_ <= 0.0),-(uint)(auVar110._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar84._8_4_ = -(uint)(auVar110._8_4_ <= 0.0) & 0x7fffffff;
                auVar84._12_4_ = -(uint)(auVar110._12_4_ <= 0.0) & 0x7fffffff;
                auVar10._4_4_ =
                     ~-(uint)(auVar110._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar96._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar107 < 0.70710677) & (uint)fVar89)) *
                             DAT_004edab0._4_4_ + fVar108 +
                            (((((((((fVar108 * 0.070376836 + -0.1151461) * fVar108 + 0.116769984) *
                                   fVar108 + -0.12420141) * fVar108 + 0.14249323) * fVar108 +
                                -0.16668057) * fVar108 + 0.20000714) * fVar108 + -0.24999994) *
                              fVar108 + 0.3333333) * fVar108 + -0.5) * fVar108 * fVar108) * -2.0);
                auVar10._0_4_ =
                     ~-(uint)(auVar110._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar96._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar105 < 0.70710677) & (uint)fVar88)) *
                             (float)DAT_004edab0 + fVar106 +
                            (((((((((fVar106 * 0.070376836 + -0.1151461) * fVar106 + 0.116769984) *
                                   fVar106 + -0.12420141) * fVar106 + 0.14249323) * fVar106 +
                                -0.16668057) * fVar106 + 0.20000714) * fVar106 + -0.24999994) *
                              fVar106 + 0.3333333) * fVar106 + -0.5) * fVar106 * fVar106) * -2.0);
                auVar10._8_4_ =
                     ~-(uint)(auVar110._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar96._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar90)) *
                             DAT_004edab0._8_4_ + fVar102 +
                            (((((((((fVar102 * 0.070376836 + -0.1151461) * fVar102 + 0.116769984) *
                                   fVar102 + -0.12420141) * fVar102 + 0.14249323) * fVar102 +
                                -0.16668057) * fVar102 + 0.20000714) * fVar102 + -0.24999994) *
                              fVar102 + 0.3333333) * fVar102 + -0.5) * fVar102 * fVar102) * -2.0);
                auVar10._12_4_ =
                     ~-(uint)(auVar110._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar96._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar103 < 0.70710677) & (uint)fVar91)) *
                             DAT_004edab0._12_4_ + fVar104 +
                            (((((((((fVar104 * 0.070376836 + -0.1151461) * fVar104 + 0.116769984) *
                                   fVar104 + -0.12420141) * fVar104 + 0.14249323) * fVar104 +
                                -0.16668057) * fVar104 + 0.20000714) * fVar104 + -0.24999994) *
                              fVar104 + 0.3333333) * fVar104 + -0.5) * fVar104 * fVar104) * -2.0);
                auVar96 = minps(auVar84 | auVar10,auVar78);
                auVar96 = maxps(auVar96,auVar79);
                fVar105 = auVar96._0_4_ * 1.442695 + 0.5;
                fVar106 = auVar96._4_4_ * 1.442695 + 0.5;
                fVar107 = auVar96._8_4_ * 1.442695 + 0.5;
                fVar108 = auVar96._12_4_ * 1.442695 + 0.5;
                fVar92 = (float)(int)fVar105;
                fVar102 = (float)(int)fVar106;
                fVar103 = (float)(int)fVar107;
                fVar104 = (float)(int)fVar108;
                fVar92 = fVar92 - (float)(-(uint)(fVar105 < fVar92) & (uint)fVar88);
                fVar102 = fVar102 - (float)(-(uint)(fVar106 < fVar102) & (uint)fVar89);
                fVar103 = fVar103 - (float)(-(uint)(fVar107 < fVar103) & (uint)fVar90);
                fVar104 = fVar104 - (float)(-(uint)(fVar108 < fVar104) & (uint)fVar91);
                fVar105 = auVar96._0_4_ - fVar92 * (float)DAT_004edab0;
                fVar106 = auVar96._4_4_ - fVar102 * DAT_004edab0._4_4_;
                fVar107 = auVar96._8_4_ - fVar103 * DAT_004edab0._8_4_;
                fVar108 = auVar96._12_4_ - fVar104 * DAT_004edab0._12_4_;
                auVar85._0_4_ =
                     fVar105 + fVar88 +
                     (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105
                       + 0.041665796) * fVar105 + 0.16666666) * fVar105 + 0.5) * fVar105 * fVar105;
                auVar85._4_4_ =
                     fVar106 + fVar89 +
                     (((((fVar106 * 0.00019875691 + 0.0013981999) * fVar106 + 0.008333452) * fVar106
                       + 0.041665796) * fVar106 + 0.16666666) * fVar106 + 0.5) * fVar106 * fVar106;
                auVar85._8_4_ =
                     fVar107 + fVar90 +
                     (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) * fVar107
                       + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) * fVar107 * fVar107;
                auVar85._12_4_ =
                     fVar108 + fVar91 +
                     (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) * fVar108
                       + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) * fVar108 * fVar108;
                fVar92 = (float)((int)fVar92 * 0x800000 + (int)fVar88) * auVar85._0_4_ + fVar88;
                fVar102 = (float)((int)fVar102 * 0x800000 + (int)fVar89) * auVar85._4_4_ + fVar89;
                fVar103 = (float)((int)fVar103 * 0x800000 + (int)fVar90) * auVar85._8_4_ + fVar90;
                fVar104 = (float)((int)fVar104 * 0x800000 + (int)fVar91) * auVar85._12_4_ + fVar91;
                auVar13._4_4_ = fVar102;
                auVar13._0_4_ = fVar92;
                auVar13._8_4_ = fVar103;
                auVar13._12_4_ = fVar104;
                auVar96 = rcpps(auVar85,auVar13);
                fVar105 = auVar96._0_4_;
                fVar106 = auVar96._4_4_;
                fVar107 = auVar96._8_4_;
                fVar108 = auVar96._12_4_;
                auVar101._0_4_ =
                     fVar105 + fVar105 + -1.0 + (2.0 - fVar92 * (fVar105 + fVar105)) * fVar105;
                auVar101._4_4_ =
                     fVar106 + fVar106 + -1.0 + (2.0 - fVar102 * (fVar106 + fVar106)) * fVar106;
                auVar101._8_4_ =
                     fVar107 + fVar107 + -1.0 + (2.0 - fVar103 * (fVar107 + fVar107)) * fVar107;
                auVar101._12_4_ =
                     fVar108 + fVar108 + -1.0 + (2.0 - fVar104 * (fVar108 + fVar108)) * fVar108;
                goto LAB_00251083;
              case 6:
                fVar105 = **(float **)(&this->field_0x118 + (long)p_Var54);
                fVar106 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                auVar100._0_4_ = fVar105 * auVar71._0_4_ + fVar106;
                auVar100._4_4_ = fVar105 * auVar71._4_4_ + fVar106;
                auVar100._8_4_ = fVar105 * fVar80 + fVar106;
                auVar100._12_4_ = fVar105 * fVar93 + fVar106;
                auVar96 = maxps(auVar100,auVar96);
                auVar101 = minps(auVar96,auVar70);
LAB_00251083:
                auVar97._0_4_ = auVar101._0_4_ * auVar71._0_4_;
                auVar97._4_4_ = auVar101._4_4_ * auVar71._4_4_;
                auVar97._8_4_ = auVar101._8_4_ * fVar80;
                auVar97._12_4_ = auVar101._12_4_ * fVar93;
              }
switchD_00250d0e_caseD_1:
              *local_260 = auVar97;
              local_260 = local_260 + 1;
              iVar30 = iVar30 + 1;
            }
            uVar36 = (ulong)(uVar48 + 1);
          }
        }
      }
      local_138 = pp_Var62;
      if (((int)local_140 == 4) && (bVar55 != 0)) {
        local_150 = pp_Var62[-3];
        uVar37 = *(uint *)(&this->field_0xd4 + (long)local_150);
        uVar65 = *(uint *)(&this->field_0xd8 + (long)local_150);
        iVar64 = *(int *)(&this->field_0xdc + (long)local_150);
        iVar67 = *(int *)(&this->field_0xe0 + (long)local_150);
        uVar69 = *(undefined4 *)(&this->field_0x114 + (long)local_150);
        local_118 = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize) *
                    local_1a8.cstep;
        pp_Var62 = (_func_int **)0x0;
        uVar52 = 0;
        if (0 < (int)uVar37) {
          uVar52 = (ulong)uVar37;
        }
        uVar44 = 0;
        if (0 < (int)uVar65) {
          uVar44 = (ulong)uVar65;
        }
        pp_Var66 = (_func_int **)(ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          pp_Var66 = pp_Var62;
        }
        uVar28 = local_1a8.w;
        if (local_1a8.w < 1) {
          uVar28 = 0;
        }
        uVar47 = local_1a8.h;
        if (local_1a8.h < 1) {
          uVar47 = 0;
        }
        local_138 = (_func_int **)(ulong)(uint)local_1a8.c;
        if (local_1a8.c < 1) {
          local_138 = pp_Var62;
        }
        iVar45 = *(int *)(&this->field_0xe4 + (long)local_150);
        iVar43 = *(int *)(&this->field_0xe8 + (long)local_150);
        lVar35 = *(long *)(&this->field_0x1a8 + (long)local_150);
        local_120 = local_1a8.data;
        iVar46 = bottom_blob->w;
        iVar56 = bottom_blob->h;
        for (; pp_Var62 != local_138; pp_Var62 = (_func_int **)((long)pp_Var62 + 1)) {
          local_270 = (float *)(local_118 * (long)pp_Var62 + (long)local_120);
          for (uVar48 = 0; uVar48 != uVar47; uVar48 = uVar48 + 1) {
            pfVar59 = *(float **)(&this->field_0x118 + (long)local_150);
            sVar5 = (this->weight_data_tm).cstep;
            sVar6 = (this->weight_data_tm).elemsize;
            pvVar40 = (this->weight_data_tm).data;
            iVar63 = (1 - uVar37) * iVar64;
            for (uVar38 = 0; uVar38 != uVar28; uVar38 = uVar38 + 1) {
              if (lVar35 == 0) {
                fVar88 = 0.0;
              }
              else {
                fVar88 = *(float *)(lVar35 + (long)pp_Var62 * 4);
              }
              auVar78 = ZEXT816(0);
              pvVar51 = (void *)(sVar5 * (long)pp_Var62 * sVar6 + (long)pvVar40);
              for (pp_Var34 = (_func_int **)0x0; pp_Var34 != pp_Var66;
                  pp_Var34 = (_func_int **)((long)pp_Var34 + 1)) {
                pvVar58 = pvVar51;
                for (uVar53 = 0; uVar53 != uVar44; uVar53 = uVar53 + 1) {
                  iVar30 = (((int)uVar53 - uVar65) + 1) * iVar67 + uVar48;
                  if (((-1 < iVar30) && (iVar26 = iVar30 / iVar43, iVar30 % iVar43 == 0)) &&
                     (iVar26 < iVar56)) {
                    iVar30 = iVar63;
                    for (lVar41 = 0; uVar52 * 0x10 != lVar41; lVar41 = lVar41 + 0x10) {
                      auVar79 = auVar78;
                      if (((-1 < iVar30) && (iVar27 = iVar30 / iVar45, iVar30 % iVar45 == 0)) &&
                         (iVar27 < iVar46)) {
                        pfVar42 = (float *)((long)pvVar58 + lVar41);
                        pfVar2 = (float *)((long)bottom_blob->data +
                                          (long)(iVar27 << 2) * 4 +
                                          (long)iVar26 *
                                          (long)bottom_blob->w * bottom_blob->elemsize +
                                          bottom_blob->cstep * bottom_blob->elemsize *
                                          (long)pp_Var34);
                        auVar79._0_4_ = auVar78._0_4_ + *pfVar42 * *pfVar2;
                        auVar79._4_4_ = auVar78._4_4_ + pfVar42[1] * pfVar2[1];
                        auVar79._8_4_ = auVar78._8_4_ + pfVar42[2] * pfVar2[2];
                        auVar79._12_4_ = auVar78._12_4_ + pfVar42[3] * pfVar2[3];
                      }
                      iVar30 = iVar30 + iVar64;
                      auVar78 = auVar79;
                    }
                  }
                  pvVar58 = (void *)((long)pvVar58 + (long)(int)uVar37 * 0x10);
                }
                pvVar51 = (void *)((long)pvVar51 + (long)(int)(uVar37 * uVar65 * 4) * 4);
              }
              fVar89 = auVar78._12_4_ + auVar78._4_4_ + fVar88 + auVar78._8_4_ + auVar78._0_4_;
              fVar88 = fVar89;
              switch(uVar69) {
              case 1:
                if (fVar89 <= 0.0) {
                  fVar88 = 0.0;
                }
                break;
              case 2:
                fVar88 = (float)(~-(uint)(0.0 < fVar89) & (uint)*pfVar59 |
                                -(uint)(0.0 < fVar89) & 0x3f800000) * fVar89;
                break;
              case 3:
                if (fVar89 <= *pfVar59) {
                  fVar89 = *pfVar59;
                }
                fVar88 = pfVar59[1];
                if (fVar89 <= pfVar59[1]) {
                  fVar88 = fVar89;
                }
                break;
              case 4:
                if (88.37626 <= fVar89) {
                  fVar89 = 88.37626;
                }
                fVar88 = expf((float)(-(uint)(fVar89 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar89 < -88.37626) & (uint)-fVar89));
                fVar88 = 1.0 / (fVar88 + 1.0);
                break;
              case 5:
                fVar88 = expf(fVar89);
                fVar88 = logf(fVar88 + 1.0);
                fVar88 = tanhf(fVar88);
                fVar88 = fVar88 * fVar89;
                break;
              case 6:
                fVar90 = *pfVar59;
                fVar91 = -pfVar59[1] / fVar90;
                fVar88 = 0.0;
                if ((fVar91 <= fVar89) && (fVar88 = fVar89, fVar89 <= fVar91 + 1.0 / fVar90)) {
                  fVar88 = (fVar90 * fVar89 + pfVar59[1]) * fVar89;
                }
              }
              *local_270 = fVar88;
              local_270 = local_270 + 1;
              iVar63 = iVar63 + 1;
            }
          }
        }
      }
      pvVar40 = local_1a8.data;
      if (bVar55 == 1 && (int)local_140 == 1) {
        pp_Var62 = this->_vptr_Deconvolution_x86;
        lVar35 = local_1a8.cstep * CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize)
        ;
        iVar64 = bottom_blob->w;
        iVar67 = bottom_blob->h;
        lVar41 = (long)local_1a8.w;
        uVar44 = 0;
        uVar52 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar52 = uVar44;
        }
        uVar53 = 0;
        if (0 < local_1a8.w) {
          uVar53 = (ulong)(uint)local_1a8.w;
        }
        uVar37 = local_1a8.h;
        if (local_1a8.h < 1) {
          uVar37 = 0;
        }
        local_130 = local_130 << 2;
        for (; (long)uVar44 < (long)*(int *)(&this->field_0xd0 + (long)pp_Var62[-3]);
            uVar44 = uVar44 + 1) {
          local_230 = (void *)(lVar35 * uVar44 + (long)pvVar40);
          for (uVar65 = 0; uVar65 != uVar37; uVar65 = uVar65 + 1) {
            pp_Var66 = this->_vptr_Deconvolution_x86;
            sVar5 = (this->weight_data_tm).cstep;
            sVar6 = (this->weight_data_tm).elemsize;
            iVar45 = uVar65 - local_148;
            pvVar51 = (this->weight_data_tm).data;
            for (uVar36 = 0; uVar36 != uVar53; uVar36 = uVar36 + 1) {
              p_Var54 = pp_Var66[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var54) == 0) {
                auVar87 = ZEXT812(0);
              }
              else {
                auVar87._4_8_ = 0;
                auVar87._0_4_ =
                     *(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var54) + uVar44 * 4);
              }
              auVar78._12_4_ = 0;
              auVar78._0_12_ = auVar87;
              pvVar58 = (void *)(sVar5 * uVar44 * sVar6 + (long)pvVar51);
              for (uVar60 = 0; fVar88 = auVar78._0_4_, uVar60 != uVar52; uVar60 = uVar60 + 1) {
                p_Var49 = this->_vptr_Deconvolution_x86[-3];
                iVar46 = 0;
                iVar43 = *(int *)(&this->field_0xd8 + (long)p_Var49);
                if (*(int *)(&this->field_0xd8 + (long)p_Var49) < 1) {
                  iVar43 = iVar46;
                }
                for (; iVar46 != iVar43; iVar46 = iVar46 + 1) {
                  iVar56 = *(int *)(&this->field_0xe0 + (long)p_Var49) * iVar46 + iVar45;
                  if (((-1 < iVar56) &&
                      (iVar63 = iVar56 / *(int *)(&this->field_0xe8 + (long)p_Var49),
                      iVar56 % *(int *)(&this->field_0xe8 + (long)p_Var49) == 0)) &&
                     (iVar63 < iVar67)) {
                    uVar28 = *(uint *)(&this->field_0xd4 + (long)p_Var49);
                    uVar39 = 0;
                    if (0 < (int)uVar28) {
                      uVar39 = (ulong)uVar28;
                    }
                    for (uVar50 = 0; uVar39 != uVar50; uVar50 = uVar50 + 1) {
                      iVar56 = *(int *)(&this->field_0xdc + (long)p_Var49) * (int)uVar50 +
                               ((int)uVar36 - local_144);
                      if (((-1 < iVar56) &&
                          (iVar30 = iVar56 / *(int *)(&this->field_0xe4 + (long)p_Var49),
                          iVar56 % *(int *)(&this->field_0xe4 + (long)p_Var49) == 0)) &&
                         (iVar30 < iVar64)) {
                        auVar78._0_4_ =
                             auVar78._0_4_ +
                             *(float *)((long)pvVar58 +
                                       uVar50 * 4 + (long)(int)(uVar28 * iVar46) * 4) *
                             *(float *)((long)bottom_blob->data +
                                       (long)iVar30 * 4 +
                                       (long)iVar63 * (long)bottom_blob->w * bottom_blob->elemsize +
                                       bottom_blob->cstep * bottom_blob->elemsize * uVar60);
                      }
                    }
                  }
                }
                pvVar58 = (void *)((long)pvVar58 + local_130);
              }
              auVar70 = auVar78;
              switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var54)) {
              case 1:
                if (fVar88 <= 0.0) {
                  auVar15._12_4_ = 0;
                  auVar15._0_12_ = auVar78._4_12_;
                  auVar70 = auVar15 << 0x20;
                }
                break;
              case 2:
                auVar70 = ZEXT416((uint)((float)(-(uint)(0.0 < fVar88) & 0x3f800000 |
                                                ~-(uint)(0.0 < fVar88) &
                                                **(uint **)(&this->field_0x118 + (long)p_Var54)) *
                                        fVar88));
                break;
              case 3:
                fVar89 = **(float **)(&this->field_0x118 + (long)p_Var54);
                if (fVar88 <= fVar89) {
                  auVar78._0_4_ = fVar89;
                }
                fVar88 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                auVar70 = auVar78;
                if (fVar88 < auVar78._0_4_) {
LAB_00251993:
                  auVar70 = ZEXT416((uint)fVar88);
                }
                break;
              case 4:
                if (88.37626 <= fVar88) {
                  fVar88 = 88.37626;
                }
                fVar88 = expf((float)(-(uint)(fVar88 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar88 < -88.37626) & (uint)-fVar88));
                auVar70 = ZEXT416((uint)(1.0 / (fVar88 + 1.0)));
                break;
              case 5:
                fVar89 = expf(fVar88);
                fVar89 = logf(fVar89 + 1.0);
                fVar89 = tanhf(fVar89);
                auVar70._0_4_ = fVar89 * fVar88;
                auVar70._4_12_ = extraout_var;
                break;
              case 6:
                fVar89 = **(float **)(&this->field_0x118 + (long)p_Var54);
                fVar90 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                fVar91 = -fVar90 / fVar89;
                auVar70 = ZEXT816(0);
                if ((fVar91 <= fVar88) && (auVar70 = auVar78, fVar88 <= fVar91 + 1.0 / fVar89)) {
                  fVar88 = (fVar89 * fVar88 + fVar90) * fVar88;
                  goto LAB_00251993;
                }
              }
              *(int *)((long)local_230 + uVar36 * 4) = auVar70._0_4_;
            }
            local_230 = (void *)((long)local_230 + lVar41 * 4);
          }
        }
      }
    }
    pMVar25 = local_128;
    Deconvolution::cut_padding
              ((Deconvolution *)
               ((long)&this->_vptr_Deconvolution_x86 + (long)this->_vptr_Deconvolution_x86[-3]),
               &local_1a8,local_128,local_158);
    if ((pMVar25->data == (void *)0x0) || (iVar64 = 0, (long)pMVar25->c * pMVar25->cstep == 0)) {
      iVar64 = -100;
    }
  }
  piVar8 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        free(local_1a8.data);
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar64;
}

Assistant:

int Deconvolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        gemm->forward(bottom_blob_2, top_col2im, opt_b);

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_load_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_load_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_load_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}